

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem2.h
# Opt level: O2

word * Mmr_FixedEntry(Mmr_Fixed_t *p,int h)

{
  void *pvVar1;
  byte bVar2;
  
  if ((0 < h) && (bVar2 = (byte)p->nPageBase, h < (p->vPages).nSize << (bVar2 & 0x1f))) {
    pvVar1 = Vec_PtrEntry(&p->vPages,(uint)h >> (bVar2 & 0x1f));
    return (word *)((long)pvVar1 + (ulong)(uint)(h & p->PageMask) * 8);
  }
  __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
}

Assistant:

static inline word * Mmr_FixedEntry( Mmr_Fixed_t * p, int h )
{
    assert( h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase) );
    return (word *)Vec_PtrEntry(&p->vPages, (h >> p->nPageBase)) + (h & p->PageMask);
}